

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateModuleFunctionPrototypes(ExpressionTranslateContext *ctx)

{
  FunctionData *function;
  ScopeData *pSVar1;
  ArgumentData *pAVar2;
  long lVar3;
  VariableHandle *pVVar4;
  bool bVar5;
  char *pcVar6;
  ExpressionContext *this;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  InplaceStr local_40;
  
  PrintIndentedLine(ctx,"// Function prototypes");
  this = ctx->ctx;
  if ((this->functions).count != 0) {
    uVar8 = 0;
    do {
      function = (this->functions).data[uVar8];
      bVar5 = ExpressionContext::IsGenericFunction(this,function);
      if ((!bVar5) && (function->implementation == (FunctionData *)0x0)) {
        pSVar1 = function->scope;
        if ((((pSVar1 == ctx->ctx->globalScope) ||
             ((pSVar1->ownerNamespace != (NamespaceData *)0x0 ||
              (pSVar1->ownerType != (TypeBase *)0x0)))) && (*(function->name->name).begin != '$'))
           && (function->isHidden != true)) {
          bVar5 = ExpressionContext::IsGenericInstance(ctx->ctx,function);
          pcVar6 = "template<int I> ";
          if (bVar5) {
LAB_00145c82:
            Print(ctx,pcVar6);
          }
          TranslateTypeName(ctx,function->type->returnType);
          Print(ctx," ");
          TranslateFunctionName(ctx,function);
          Print(ctx,"(");
          if (function->importModule == (ModuleData *)0x0) {
            for (pVVar4 = (function->argumentVariables).head; pVVar4 != (VariableHandle *)0x0;
                pVVar4 = pVVar4->next) {
              TranslateTypeName(ctx,pVVar4->variable->type);
              Print(ctx," ");
              TranslateVariableName(ctx,pVVar4->variable);
              Print(ctx,", ");
            }
            TranslateTypeName(ctx,function->contextArgument->type);
            Print(ctx," ");
            TranslateVariableName(ctx,function->contextArgument);
          }
          else {
            if ((function->arguments).count != 0) {
              lVar9 = 0x10;
              uVar7 = 0;
              do {
                pAVar2 = (function->arguments).data;
                TranslateTypeName(ctx,*(TypeBase **)(&pAVar2->isExplicit + lVar9));
                Print(ctx," ");
                local_40.begin = "this";
                local_40.end = "";
                bVar5 = InplaceStr::operator==
                                  ((InplaceStr *)(*(long *)((long)&pAVar2->source + lVar9) + 0x40),
                                   &local_40);
                if (bVar5) {
                  Print(ctx,"__context");
                }
                else {
                  lVar3 = *(long *)((long)&pAVar2->source + lVar9);
                  pcVar6 = *(char **)(lVar3 + 0x40);
                  if (*pcVar6 == '$') {
                    if (*(char **)(lVar3 + 0x48) < pcVar6 + 1) {
                      __assert_fail("strEnd >= strBegin",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                                    ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
                    }
                    Print(ctx,"__%.*s",
                          (ulong)(uint)((int)*(char **)(lVar3 + 0x48) - (int)(pcVar6 + 1)));
                  }
                  else {
                    Print(ctx,"%.*s",(ulong)(uint)(*(int *)(lVar3 + 0x48) - (int)pcVar6));
                  }
                }
                Print(ctx,", ");
                uVar7 = uVar7 + 1;
                lVar9 = lVar9 + 0x30;
              } while (uVar7 < (function->arguments).count);
            }
            TranslateTypeName(ctx,function->contextType);
            Print(ctx," __context");
          }
          Print(ctx,");");
          OutputContext::Print(ctx->output,"\n",1);
        }
        else {
          pcVar6 = "static ";
          if (function->importModule == (ModuleData *)0x0) goto LAB_00145c82;
        }
      }
      uVar8 = uVar8 + 1;
      this = ctx->ctx;
    } while (uVar8 < (this->functions).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleFunctionPrototypes(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Function prototypes");

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
			continue;

		if(function->implementation)
			continue;

		bool isStatic = false;
		bool isGeneric = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;
		else if(ctx.ctx.IsGenericInstance(function))
			isGeneric = true;

		if(isStatic && function->importModule)
			continue;

		if(isStatic)
			Print(ctx, "static ");
		else if(isGeneric)
			Print(ctx, "template<int I> ");

		TranslateTypeName(ctx, function->type->returnType);
		Print(ctx, " ");
		TranslateFunctionName(ctx, function);
		Print(ctx, "(");

		if(function->importModule)
		{
			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &argument = function->arguments[i];

				TranslateTypeName(ctx, argument.type);
				Print(ctx, " ");

				if(argument.name->name == InplaceStr("this"))
				{
					Print(ctx, "__context");
				}
				else if(*argument.name->name.begin == '$')
				{
					InplaceStr name = InplaceStr(argument.name->name.begin + 1, argument.name->name.end);

					Print(ctx, "__%.*s", FMT_ISTR(name));
				}
				else
				{
					Print(ctx, "%.*s", FMT_ISTR(argument.name->name));
				}

				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, function->contextType);
			Print(ctx, " __context");
		}
		else
		{
			for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
			{
				TranslateTypeName(ctx, curr->variable->type);
				Print(ctx, " ");
				TranslateVariableName(ctx, curr->variable);
				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, function->contextArgument->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, function->contextArgument);
		}

		Print(ctx, ");");
		PrintLine(ctx);
	}

	PrintLine(ctx);
}